

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::load_0(xr_bone *this,xr_reader *r)

{
  float fVar1;
  xr_reader *r_local;
  xr_bone *this_local;
  
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::r_sz(r,&this->m_parent_name);
  xr_reader::r_sz(r,&this->m_vmap_name);
  xr_reader::r_fvector3(r,&this->m_bind_offset);
  xr_reader::r_fvector3(r,&this->m_bind_rotate);
  fVar1 = xr_reader::r_float(r);
  this->m_bind_length = fVar1;
  std::swap<float>((float *)&this->m_bind_offset,&(this->m_bind_offset).field_0.field_0.y);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                ,0x3a,"void xray_re::xr_bone::load_0(xr_reader &)");
}

Assistant:

void xr_bone::load_0(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	r.r_sz(m_vmap_name);
	r.r_fvector3(m_bind_offset);
	r.r_fvector3(m_bind_rotate);
	m_bind_length = r.r_float();
	std::swap(m_bind_offset.x, m_bind_offset.y);

	// FIXME: reset other fields
	xr_not_implemented();
}